

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RTIMULSM9DS1.cpp
# Opt level: O0

bool __thiscall RTIMULSM9DS1::setCompassCTRL2(RTIMULSM9DS1 *this)

{
  bool bVar1;
  uchar local_19;
  uchar ctrl2;
  RTIMULSM9DS1 *this_local;
  
  switch(((this->super_RTIMU).m_settings)->m_LSM9DS1CompassFsr) {
  case 0:
    local_19 = '\0';
    this->m_compassScale = 0.014;
    break;
  case 1:
    local_19 = ' ';
    this->m_compassScale = 0.029;
    break;
  case 2:
    local_19 = '@';
    this->m_compassScale = 0.043;
    break;
  case 3:
    local_19 = '`';
    this->m_compassScale = 0.058;
    break;
  default:
    fprintf(_stderr,"Illegal LSM9DS1 compass FSR code %d\n",
            (ulong)(uint)((this->super_RTIMU).m_settings)->m_LSM9DS1CompassFsr);
    return false;
  }
  bVar1 = RTIMUHal::HALWrite(&((this->super_RTIMU).m_settings)->super_RTIMUHal,this->m_magSlaveAddr,
                             '!',local_19,"Failed to set LSM9DS1 compass CTRL6");
  return bVar1;
}

Assistant:

bool RTIMULSM9DS1::setCompassCTRL2()
{
    unsigned char ctrl2;

    //  convert FSR to uT

    switch (m_settings->m_LSM9DS1CompassFsr) {
    case LSM9DS1_COMPASS_FSR_4:
        ctrl2 = 0;
        m_compassScale = (RTFLOAT)0.014;
        break;

    case LSM9DS1_COMPASS_FSR_8:
        ctrl2 = 0x20;
        m_compassScale = (RTFLOAT)0.029;
        break;

    case LSM9DS1_COMPASS_FSR_12:
        ctrl2 = 0x40;
        m_compassScale = (RTFLOAT)0.043;
        break;

    case LSM9DS1_COMPASS_FSR_16:
        ctrl2 = 0x60;
        m_compassScale = (RTFLOAT)0.058;
        break;

    default:
        HAL_ERROR1("Illegal LSM9DS1 compass FSR code %d\n", m_settings->m_LSM9DS1CompassFsr);
        return false;
    }

    return m_settings->HALWrite(m_magSlaveAddr, LSM9DS1_MAG_CTRL2, ctrl2, "Failed to set LSM9DS1 compass CTRL6");
}